

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O1

CEExecOptions * __thiscall CEExecOptions::GenObserver(CEExecOptions *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CLOptions *in_RSI;
  _Base_ptr p_Var2;
  double dVar3;
  string local_a8;
  double local_88;
  double local_80;
  CEAngleType local_74;
  string local_70;
  string local_50;
  double local_30;
  
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"longitude","");
  local_80 = CLOptions::AsDouble(in_RSI,&local_a8);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"latitude","");
  local_88 = CLOptions::AsDouble(in_RSI,&local_50);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"elevation","");
  local_30 = CLOptions::AsDouble(in_RSI,&local_70);
  local_74 = DEGREES;
  CEObserver::CEObserver((CEObserver *)this,&local_80,&local_88,&local_30,&local_74);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"humidity","");
  p_Var2 = (_Base_ptr)CLOptions::AsDouble(in_RSI,&local_a8);
  (this->super_CLOptions).params_bools._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       p_Var2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"pressure","");
  dVar3 = CLOptions::AsDouble(in_RSI,&local_a8);
  *(double *)&(this->super_CLOptions).params_bools._M_t._M_impl = dVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"wavelength","");
  p_Var2 = (_Base_ptr)CLOptions::AsDouble(in_RSI,&local_a8);
  (this->super_CLOptions).params_bools._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var2
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return this;
}

Assistant:

inline
CEObserver CEExecOptions::GenObserver(void)
{
    CEObserver obs(AsDouble("longitude"),
                   AsDouble("latitude"),
                   AsDouble("elevation"),
                   CEAngleType::DEGREES);
    obs.SetRelativeHumidity(AsDouble("humidity"));
    obs.SetPressure_hPa(AsDouble("pressure"));
    obs.SetWavelength_um(AsDouble("wavelength"));

    return obs;
}